

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O3

void predict_or_learn<false>(LRQstate *lrq,single_learner *base,example *ec)

{
  sparse_parameters *this;
  features *this_00;
  float fVar1;
  byte bVar2;
  byte bVar3;
  vw *pvVar4;
  byte *pbVar5;
  long lVar6;
  vw *pvVar7;
  _func_void_weight_ptr_void_ptr *p_Var8;
  element_type *peVar9;
  bool bVar10;
  features *pfVar11;
  uint uVar12;
  byte *pbVar13;
  uint32_t *puVar14;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var15;
  ostream *poVar16;
  char *pcVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  ulong uVar18;
  _Base_ptr p_Var19;
  uint uVar20;
  float *pfVar21;
  size_t *__s;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  uint uVar25;
  float fVar26;
  uint64_t index;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  element_type local_230;
  features *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  long local_1d8;
  long local_1d0;
  char *local_1c8;
  char *local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  pvVar4 = lrq->all;
  __s = lrq->orig_size;
  local_230.first.field_2._M_allocated_capacity = (size_type)base;
  memset(__s,0,0x800);
  pbVar5 = (ec->super_example_predict).indices._end;
  for (pbVar13 = (ec->super_example_predict).indices._begin; pbVar13 != pbVar5;
      pbVar13 = (byte *)((long)pbVar13 + 1)) {
    bVar2 = *pbVar13;
    if (lrq->lrindices[bVar2] == true) {
      __s[bVar2] = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
    }
  }
  if (lrq->dropout == false) {
    fVar26 = 1.0;
  }
  else {
    fVar26 = 0.5;
  }
  uVar23 = &(lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  uVar24 = (ec->super_example_predict).feature_space;
  puVar14 = &(pvVar4->weights).dense_weights._stride_shift;
  if ((pvVar4->weights).sparse != false) {
    puVar14 = &(pvVar4->weights).sparse_weights._stride_shift;
  }
  p_Var19 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar20 = (uint)ec->example_counter;
  if (p_Var19 != (_Base_ptr)uVar23) {
    local_1e0 = (ulong)*puVar14;
    local_230.second._M_string_length = (size_type)(uVar20 & 1);
    local_230.second._M_dataplus._M_p = (pointer)(local_230.second._M_string_length ^ 1);
    local_230.first.field_2._8_8_ = uVar23;
    local_230.second.field_2._8_8_ = uVar24;
    do {
      lVar6 = *(long *)(p_Var19 + 1);
      bVar2 = *(byte *)(lVar6 + local_230.second._M_string_length);
      bVar3 = local_230.second._M_dataplus._M_p[lVar6];
      local_230.second.field_2._M_allocated_capacity = (size_type)p_Var19;
      uVar12 = atoi((char *)(lVar6 + 2));
      uVar18 = __s[bVar2];
      if (uVar18 != 0) {
        local_1f0 = (features *)(uVar24 + (ulong)bVar2 * 0x68);
        this_00 = (features *)(uVar24 + (ulong)bVar3 * 0x68);
        pfVar11 = (features *)(uVar24 + (ulong)bVar3 * 0x68);
        uVar22 = 0;
        do {
          if (uVar12 != 0) {
            local_1d8 = (ec->super_example_predict).ft_offset + (local_1f0->indicies)._begin[uVar22]
            ;
            fVar1 = (local_1f0->values)._begin[uVar22];
            uVar25 = 1;
            local_1e8 = uVar22;
            do {
              local_1d0 = (ulong)uVar25 << ((byte)local_1e0 & 0x3f);
              pvVar7 = lrq->all;
              if ((pvVar7->weights).sparse == true) {
                this = &(pvVar7->weights).sparse_weights;
                local_240.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)
                          (local_1d8 + local_1d0 & (pvVar7->weights).sparse_weights._weight_mask);
                _Var15._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,(key_type *)&local_240);
                if (_Var15._M_cur == (__node_type *)0x0) {
                  local_1b0 = calloc_or_throw<float>
                                        (1L << ((byte)(pvVar7->weights).sparse_weights._stride_shift
                                               & 0x3f));
                  local_1b8 = local_240.
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<unsigned_long,float*>>
                            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)this,&local_1b8);
                  _Var15._M_cur =
                       (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)this,(key_type *)&local_240);
                  p_Var8 = (pvVar7->weights).sparse_weights.fun;
                  if (p_Var8 != (_func_void_weight_ptr_void_ptr *)0x0) {
                    (*p_Var8)(*(weight **)((long)_Var15._M_cur + 0x10),
                              (pvVar7->weights).sparse_weights.default_data);
                  }
                }
                pfVar21 = *(float **)
                           ((long)&((_Var15._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                   ._M_storage._M_storage + 8);
              }
              else {
                pfVar21 = (pvVar7->weights).dense_weights._begin +
                          (local_1d8 + local_1d0 & (pvVar7->weights).dense_weights._weight_mask);
              }
              if (__s[bVar3] != 0) {
                uVar18 = 0;
                uVar22 = 1;
                do {
                  features::push_back(this_00,*pfVar21 * fVar26 * fVar1 *
                                              (this_00->values)._begin[uVar18],
                                      (this_00->indicies)._begin[uVar18] + local_1d0);
                  if ((pvVar4->audit != false) || (pvVar4->hash_inv == true)) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                    local_240.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_ = bVar3;
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,(char *)&local_240,1);
                    local_240.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._0_1_ = 0x5e;
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(char *)&local_240,1);
                    peVar9 = (pfVar11->space_names)._begin[uVar18].
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(peVar9->second)._M_dataplus._M_p,
                                         (peVar9->second)._M_string_length);
                    local_240.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)
                              CONCAT71(local_240.
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._1_7_,0x5e);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar16,(char *)&local_240,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                    local_1c0 = strdup("lrq");
                    std::__cxx11::stringbuf::str();
                    peVar9 = local_240.
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    pcVar17 = strdup((char *)local_240.
                                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                    if (peVar9 != &local_230) {
                      operator_delete(peVar9);
                    }
                    local_1c8 = pcVar17;
                    this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)operator_new(0x40);
                    std::
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::pair<char_*&,_char_*&,_true>(this_01,&local_1c0,&local_1c8);
                    local_240.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = this_01;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                              (&local_240.
                                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,this_01);
                    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::push_back(&pfVar11->space_names,&local_240);
                    if (local_240.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_240.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
                    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                  }
                  bVar10 = uVar22 < __s[bVar3];
                  uVar18 = uVar22;
                  uVar22 = (ulong)((int)uVar22 + 1);
                } while (bVar10);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 <= uVar12);
            uVar18 = __s[bVar2];
            uVar22 = local_1e8;
            uVar24 = local_230.second.field_2._8_8_;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (uVar22 < uVar18);
      }
      p_Var19 = (_Base_ptr)
                std::_Rb_tree_increment
                          ((_Rb_tree_node_base *)local_230.second.field_2._M_allocated_capacity);
      uVar23 = local_230.first.field_2._8_8_;
    } while (p_Var19 != (_Base_ptr)local_230.first.field_2._8_8_);
  }
  (**(code **)(local_230.first.field_2._M_allocated_capacity + 0x30))
            (*(undefined8 *)(local_230.first.field_2._M_allocated_capacity + 0x18),
             *(undefined8 *)(local_230.first.field_2._M_allocated_capacity + 0x20),ec);
  p_Var19 = (lrq->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var19 != (_Base_ptr)uVar23) {
    do {
      bVar2 = *(byte *)(*(long *)(p_Var19 + 1) + (ulong)(~uVar20 & 1));
      features::truncate_to((features *)(uVar24 + (ulong)bVar2 * 0x68),__s[bVar2]);
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != (_Base_ptr)uVar23);
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}